

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_ConflictingFileError_Test::
~DescriptorDatabaseTest_ConflictingFileError_Test
          (DescriptorDatabaseTest_ConflictingFileError_Test *this)

{
  protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingFileError_Test::
  ~DescriptorDatabaseTest_ConflictingFileError_Test
            ((DescriptorDatabaseTest_ConflictingFileError_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingFileError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "}");
  AddToDatabaseWithError(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "}");
}